

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O3

void __thiscall QProgressBar::paintEvent(QProgressBar *this,QPaintEvent *param_1)

{
  long lVar1;
  long in_FS_OFFSET;
  QStyleOptionProgressBar opt;
  undefined1 *local_b8;
  QProgressBar *pQStack_b0;
  QStyle *local_a8;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  QPalettePrivate *pQStack_70;
  undefined1 *local_68;
  QObject *pQStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QArrayData *local_48;
  char16_t *pcStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_b0 = (QProgressBar *)&DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_b8);
  pQStack_b0 = this;
  local_a8 = QWidget::style(&this->super_QWidget);
  QPainter::begin((QPaintDevice *)&local_b8);
  QPainter::setRenderHint((RenderHint)&local_b8,true);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_40 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_60 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_70 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionProgressBar::QStyleOptionProgressBar((QStyleOptionProgressBar *)local_98);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a8))(this,(QStyleOptionProgressBar *)local_98);
  (**(code **)(*(long *)local_a8 + 0xb8))
            (local_a8,10,(QStyleOptionProgressBar *)local_98,&local_b8,pQStack_b0);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(undefined4 *)(lVar1 + 0x268) = *(undefined4 *)(lVar1 + 0x25c);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)local_98);
  QPainter::~QPainter((QPainter *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QProgressBar::paintEvent(QPaintEvent *)
{
    QStylePainter paint(this);
    QStyleOptionProgressBar opt;
    initStyleOption(&opt);
    paint.drawControl(QStyle::CE_ProgressBar, opt);
    d_func()->lastPaintedValue = d_func()->value;
}